

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

any * __thiscall linb::any::operator=(any *this,any *rhs)

{
  storage_union sStack_28;
  vtable_type *local_18;
  
  local_18 = rhs->vtable;
  if (local_18 != (vtable_type *)0x0) {
    (*local_18->copy)(&rhs->storage,&sStack_28);
  }
  swap((any *)&sStack_28,this);
  if (local_18 != (vtable_type *)0x0) {
    (*local_18->destroy)(&sStack_28);
  }
  return this;
}

Assistant:

any& operator=(const any& rhs)
    {
        any(rhs).swap(*this);
        return *this;
    }